

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPublicKey.cpp
# Opt level: O0

void __thiscall OSSLDHPublicKey::createOSSLKey(OSSLDHPublicKey *this)

{
  DH *pDVar1;
  DH_METHOD *meth;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  long in_RDI;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_g;
  BIGNUM *bn_p;
  ByteString *in_stack_ffffffffffffffc8;
  
  if (*(long *)(in_RDI + 0x80) == 0) {
    pDVar1 = DH_new();
    *(DH **)(in_RDI + 0x80) = pDVar1;
    if (*(long *)(in_RDI + 0x80) == 0) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLDHPublicKey.cpp"
                 ,0x95,"Could not create DH object");
    }
    else {
      pDVar1 = *(DH **)(in_RDI + 0x80);
      meth = DH_OpenSSL();
      DH_set_method(pDVar1,meth);
      pBVar2 = OSSL::byteString2bn(in_stack_ffffffffffffffc8);
      pBVar3 = OSSL::byteString2bn(in_stack_ffffffffffffffc8);
      pBVar4 = OSSL::byteString2bn(in_stack_ffffffffffffffc8);
      DH_set0_pqg(*(undefined8 *)(in_RDI + 0x80),pBVar2,0,pBVar3);
      DH_set0_key(*(undefined8 *)(in_RDI + 0x80),pBVar4,0);
    }
  }
  return;
}

Assistant:

void OSSLDHPublicKey::createOSSLKey()
{
	if (dh != NULL) return;

	dh = DH_new();
	if (dh == NULL)
	{
		ERROR_MSG("Could not create DH object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		DH_set_method(dh, FIPS_dh_openssl());
	else
		DH_set_method(dh, DH_OpenSSL());
#else
	DH_set_method(dh, DH_OpenSSL());
#endif

#else
	DH_set_method(dh, DH_OpenSSL());
#endif

	BIGNUM* bn_p = OSSL::byteString2bn(p);
	BIGNUM* bn_g = OSSL::byteString2bn(g);
	BIGNUM* bn_pub_key = OSSL::byteString2bn(y);

	DH_set0_pqg(dh, bn_p, NULL, bn_g);
	DH_set0_key(dh, bn_pub_key, NULL);
}